

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
llvm::cl::parser<unsigned_int>::parse
          (parser<unsigned_int> *this,Option *O,StringRef ArgName,StringRef Arg,uint *Value)

{
  Child LHS;
  Child CVar1;
  bool bVar2;
  raw_ostream *Errs;
  Child RHS;
  StringRef Str;
  unsigned_long_long ULLVal;
  Child local_78 [2];
  undefined8 local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  undefined4 local_40;
  undefined4 uStack_3c;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = Arg.Length;
  local_28.Data = Arg.Data;
  Str.Length = 0;
  Str.Data = (char *)local_28.Length;
  bVar2 = getAsUnsignedInteger
                    ((llvm *)local_28.Data,Str,(uint)local_78,(unsigned_long_long *)local_28.Data);
  if ((bVar2) || (local_78[0]._4_4_ != 0)) {
    Twine::Twine((Twine *)&local_40,"\'",&local_28);
    Twine::Twine((Twine *)&local_58,"\' value invalid for uint argument!");
    if ((local_30 == NullKind) || (local_48 == NullKind)) {
      local_68 = CONCAT62(local_68._2_6_,0x100);
    }
    else if (local_30 == EmptyKind) {
      local_68 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
    }
    else if (local_48 == EmptyKind) {
      local_68 = CONCAT62(uStack_2e,CONCAT11(cStack_2f,local_30));
    }
    else {
      LHS._4_4_ = uStack_3c;
      LHS.decUI = local_40;
      if (cStack_2f != '\x01') {
        local_30 = TwineKind;
        LHS.twine = (Twine *)&local_40;
      }
      if (cStack_47 != '\x01') {
        local_48 = TwineKind;
      }
      CVar1._4_4_ = uStack_54;
      CVar1.decUI = local_58;
      RHS.twine = (Twine *)&local_58;
      if (cStack_47 == '\x01') {
        RHS = CVar1;
      }
      Twine::Twine((Twine *)local_78,LHS,local_30,RHS,local_48);
    }
    Errs = errs();
    Option::error(O,(Twine *)local_78,(StringRef)ZEXT816(0),Errs);
    bVar2 = true;
  }
  else {
    *Value = local_78[0].decUI;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool parser<unsigned>::parse(Option &O, StringRef ArgName, StringRef Arg,
                             unsigned &Value) {

  if (Arg.getAsInteger(0, Value))
    return O.error("'" + Arg + "' value invalid for uint argument!");
  return false;
}